

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O3

rect<int> __thiscall
irr::gui::CGUISkin::draw3DWindowBackground
          (CGUISkin *this,IGUIElement *element,bool drawTitleBar,SColor titleBarColor,rect<int> *r,
          rect<int> *clip,rect<int> *checkClientArea)

{
  rect<int> rVar1;
  uint uVar2;
  SColor SVar3;
  SColor SVar4;
  int iVar5;
  SColor SVar6;
  undefined7 in_register_00000011;
  IVideoDriver *pIVar7;
  vector2d<int> vVar8;
  int *piVar9;
  _func_int **pp_Var10;
  rect<int> *prVar11;
  rect<int> local_78;
  SColor local_5c;
  u32 local_58;
  SColor local_54;
  undefined4 local_50;
  SColor local_4c;
  vector2d<int> local_48;
  undefined8 uStack_40;
  int *local_38;
  
  local_54.color = titleBarColor.color;
  pIVar7 = this->Driver;
  if (pIVar7 == (IVideoDriver *)0x0) {
    if (checkClientArea != (rect<int> *)0x0) {
      vVar8 = r->LowerRightCorner;
      checkClientArea->UpperLeftCorner = r->UpperLeftCorner;
      checkClientArea->LowerRightCorner = vVar8;
    }
    local_78.UpperLeftCorner.X = (r->UpperLeftCorner).X;
    local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
    local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
    local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
  }
  else {
    local_50 = (int)CONCAT71(in_register_00000011,drawTitleBar);
    local_58 = titleBarColor.color;
    local_78.UpperLeftCorner.X = (r->UpperLeftCorner).X;
    local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
    local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
    local_78.LowerRightCorner.Y = local_78.UpperLeftCorner.Y + 1;
    if (checkClientArea == (rect<int> *)0x0) {
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,&local_78,clip);
      local_48 = (vector2d<int>)&r->LowerRightCorner;
      local_38 = &(r->LowerRightCorner).Y;
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      local_78.LowerRightCorner.X = local_78.UpperLeftCorner.X + 1;
      pIVar7 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,&local_78,clip);
      local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
      local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
      local_78.UpperLeftCorner.X = local_78.LowerRightCorner.X + -1;
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      pIVar7 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,&local_78,clip);
      local_78.LowerRightCorner.X = local_78.LowerRightCorner.X + -1;
      vVar8 = local_48;
      piVar9 = local_38;
    }
    else {
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
      local_78.UpperLeftCorner.X = (r->LowerRightCorner).X + -1;
      vVar8 = (vector2d<int>)&r->LowerRightCorner;
      piVar9 = &(r->LowerRightCorner).Y;
      local_78.LowerRightCorner.X = local_78.UpperLeftCorner.X;
    }
    local_78.UpperLeftCorner.X = local_78.UpperLeftCorner.X + -1;
    local_78.UpperLeftCorner.Y = local_78.UpperLeftCorner.Y + 1;
    local_78.LowerRightCorner.Y = local_78.LowerRightCorner.Y + -1;
    if (checkClientArea == (rect<int> *)0x0) {
      pIVar7 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      prVar11 = &local_78;
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,prVar11,clip);
      local_78.UpperLeftCorner.X = (r->UpperLeftCorner).X;
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      local_78.UpperLeftCorner.Y = local_78.LowerRightCorner.Y + -1;
      local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
      pIVar7 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,prVar11,clip);
      local_78.LowerRightCorner.Y = local_78.LowerRightCorner.Y + -1;
    }
    else {
      local_78.LowerRightCorner.Y = *piVar9 + -1;
      local_78.LowerRightCorner.X = ((vector2d<int> *)vVar8)->X;
      prVar11 = r;
      local_78.UpperLeftCorner.Y = local_78.LowerRightCorner.Y;
    }
    local_78.UpperLeftCorner.X = (prVar11->UpperLeftCorner).X + 1;
    local_78.LowerRightCorner.X = local_78.LowerRightCorner.X + -1;
    local_78.UpperLeftCorner.Y = local_78.UpperLeftCorner.Y + -1;
    if (checkClientArea == (rect<int> *)0x0) {
      pIVar7 = this->Driver;
      uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,&local_78,clip);
      local_78.UpperLeftCorner.X = (r->UpperLeftCorner).X;
      local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
      local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      local_78.UpperLeftCorner.X = local_78.UpperLeftCorner.X + 1;
      local_78.UpperLeftCorner.Y = local_78.UpperLeftCorner.Y + 1;
      local_78.LowerRightCorner.X = local_78.LowerRightCorner.X + -2;
      local_78.LowerRightCorner.Y = local_78.LowerRightCorner.Y + -2;
      if (this->UseGradient == false) {
        pIVar7 = this->Driver;
        uVar2 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        (*pIVar7->_vptr_IVideoDriver[0x33])(pIVar7,(ulong)uVar2,&local_78,clip);
      }
      else {
        if (this->Type == EGST_BURNING_SKIN) {
          local_5c.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0x11);
          local_4c.color = 0xffffffff;
          SVar3 = video::SColor::getInterpolated(&local_5c,&local_4c,0.9);
          local_5c.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0x11);
          local_4c.color = 0xffffffff;
          SVar6 = video::SColor::getInterpolated(&local_5c,&local_4c,0.8);
          pIVar7 = this->Driver;
          pp_Var10 = pIVar7->_vptr_IVideoDriver;
          SVar4 = SVar6;
        }
        else {
          SVar6.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
          SVar3.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
          pIVar7 = this->Driver;
          pp_Var10 = pIVar7->_vptr_IVideoDriver;
          SVar4.color = SVar3.color;
        }
        (*pp_Var10[0x34])(pIVar7,&local_78,(ulong)SVar3.color,(ulong)SVar3.color,(ulong)SVar4.color,
                          (ulong)SVar6.color,clip);
      }
    }
    else {
      local_78.UpperLeftCorner.X = (r->UpperLeftCorner).X;
      local_78.UpperLeftCorner.Y = (r->UpperLeftCorner).Y;
      local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
      local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
      (checkClientArea->UpperLeftCorner).X = local_78.UpperLeftCorner.X + 1;
      (checkClientArea->UpperLeftCorner).Y = local_78.UpperLeftCorner.Y + 1;
      (checkClientArea->LowerRightCorner).X = local_78.LowerRightCorner.X + -2;
      (checkClientArea->LowerRightCorner).Y = local_78.LowerRightCorner.Y + -2;
    }
    local_48 = r->UpperLeftCorner;
    local_78.LowerRightCorner.X = (r->LowerRightCorner).X;
    local_78.LowerRightCorner.Y = (r->LowerRightCorner).Y;
    uStack_40 = 0;
    local_78.UpperLeftCorner.X = local_48.X + 2;
    local_78.UpperLeftCorner.Y = local_48.Y + 2;
    local_78.LowerRightCorner.X = local_78.LowerRightCorner.X + -2;
    iVar5 = (*(this->super_IGUISkin)._vptr_IGUISkin[2])(this,2);
    local_78.LowerRightCorner.Y = iVar5 + local_48.Y + 4;
    if ((char)local_50 != '\0') {
      if (checkClientArea == (rect<int> *)0x0) {
        if (this->Type == EGST_BURNING_SKIN) {
          local_5c.color = local_58 | 0xffffff;
          SVar6 = video::SColor::getInterpolated(&local_54,&local_5c,0.8);
          pIVar7 = this->Driver;
          pp_Var10 = pIVar7->_vptr_IVideoDriver;
          SVar4.color = local_54.color;
          SVar3 = SVar6;
        }
        else {
          local_5c.color = local_58 & 0xff000000;
          SVar6 = video::SColor::getInterpolated(&local_54,&local_5c,0.2);
          pIVar7 = this->Driver;
          pp_Var10 = pIVar7->_vptr_IVideoDriver;
          SVar4 = SVar6;
          SVar3.color = local_54.color;
        }
        (*pp_Var10[0x34])(pIVar7,&local_78,(ulong)local_54.color,(ulong)SVar4.color,
                          (ulong)SVar3.color,(ulong)SVar6.color,clip);
      }
      else {
        (checkClientArea->UpperLeftCorner).Y = local_78.LowerRightCorner.Y;
      }
    }
  }
  rVar1.UpperLeftCorner.Y = local_78.UpperLeftCorner.Y;
  rVar1.UpperLeftCorner.X = local_78.UpperLeftCorner.X;
  rVar1.LowerRightCorner.X = local_78.LowerRightCorner.X;
  rVar1.LowerRightCorner.Y = local_78.LowerRightCorner.Y;
  return rVar1;
}

Assistant:

core::rect<s32> CGUISkin::draw3DWindowBackground(IGUIElement *element,
		bool drawTitleBar, video::SColor titleBarColor,
		const core::rect<s32> &r,
		const core::rect<s32> *clip,
		core::rect<s32> *checkClientArea)
{
	if (!Driver) {
		if (checkClientArea) {
			*checkClientArea = r;
		}
		return r;
	}

	core::rect<s32> rect = r;

	// top border
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// left border
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = rect.UpperLeftCorner.X + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// right border dark outer line
	rect.UpperLeftCorner.X = r.LowerRightCorner.X - 1;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	rect.UpperLeftCorner.Y = r.UpperLeftCorner.Y;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// right border bright innner line
	rect.UpperLeftCorner.X -= 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// bottom border dark outer line
	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// bottom border bright inner line
	rect.UpperLeftCorner.X += 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y -= 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// client area for background
	rect = r;
	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y -= 2;
	if (checkClientArea) {
		*checkClientArea = rect;
	}

	if (!checkClientArea) {
		if (!UseGradient) {
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
		} else if (Type == EGST_BURNING_SKIN) {
			const video::SColor c1 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.9f);
			const video::SColor c2 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.8f);

			Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
		} else {
			const video::SColor c2 = getColor(EGDC_3D_SHADOW);
			const video::SColor c1 = getColor(EGDC_3D_FACE);
			Driver->draw2DRectangle(rect, c1, c1, c1, c2, clip);
		}
	}

	// title bar
	rect = r;
	rect.UpperLeftCorner.X += 2;
	rect.UpperLeftCorner.Y += 2;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + getSize(EGDS_WINDOW_BUTTON_WIDTH) + 2;

	if (drawTitleBar) {
		if (checkClientArea) {
			(*checkClientArea).UpperLeftCorner.Y = rect.LowerRightCorner.Y;
		} else {
			// draw title bar
			// if (!UseGradient)
			//	Driver->draw2DRectangle(titleBarColor, rect, clip);
			// else
			if (Type == EGST_BURNING_SKIN) {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 255, 255, 255), 0.8f);
				Driver->draw2DRectangle(rect, titleBarColor, titleBarColor, c, c, clip);
			} else {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 0, 0, 0), 0.2f);
				Driver->draw2DRectangle(rect, titleBarColor, c, titleBarColor, c, clip);
			}
		}
	}

	return rect;
}